

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgviz.hpp
# Opt level: O2

Vec3b __thiscall imgviz::getLabelColor(imgviz *this,uint8_t label)

{
  byte bVar1;
  long lVar2;
  imgviz iVar3;
  uint8_t id;
  imgviz iVar4;
  imgviz iVar5;
  
  lVar2 = 8;
  iVar3 = (imgviz)0x0;
  iVar4 = (imgviz)0x0;
  iVar5 = (imgviz)0x0;
  while (lVar2 != 0) {
    lVar2 = lVar2 + -1;
    bVar1 = (byte)lVar2;
    iVar3 = (imgviz)((byte)iVar3 | (byte)((label & 1) << (bVar1 & 0x1f)));
    iVar4 = (imgviz)((byte)iVar4 | (byte)((label >> 1 & 1) << (bVar1 & 0x1f)));
    iVar5 = (imgviz)((byte)iVar5 | (byte)((label >> 2 & 1) << (bVar1 & 0x1f)));
    label = label >> 3;
  }
  *this = iVar5;
  this[1] = iVar4;
  this[2] = iVar3;
  return (Vec3b)SUB83(this,0);
}

Assistant:

cv::Vec3b getLabelColor(const uint8_t label) {
  // VOC label colormap
  uint8_t id = label;
  uint8_t r = 0;
  uint8_t g = 0;
  uint8_t b = 0;
  for (size_t i = 0; i < 8; ++i) {
    r |= ((id & (1 << 0)) != 0) << (7 - i);
    g |= ((id & (1 << 1)) != 0) << (7 - i);
    b |= ((id & (1 << 2)) != 0) << (7 - i);
    id = id >> 3;
  }
  return cv::Vec3b(b, g, r);
}